

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_287390::CAPIBuildSystemFrontendDelegate::CAPIRulesVector::~CAPIRulesVector
          (CAPIRulesVector *this)

{
  pointer ppCVar1;
  vector<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
  *__range2;
  pointer ppCVar2;
  
  ppCVar1 = (this->rules).
            super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar2 = (this->rules).
                 super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar2 != ppCVar1;
      ppCVar2 = ppCVar2 + 1) {
    llb_build_key_destroy((llb_build_key_t *)*ppCVar2);
  }
  ppCVar2 = (this->rules).
            super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar2 != (pointer)0x0) {
    operator_delete(ppCVar2,(long)(this->rules).
                                  super__Vector_base<(anonymous_namespace)::CAPIBuildKey_*,_std::allocator<(anonymous_namespace)::CAPIBuildKey_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar2
                   );
    return;
  }
  return;
}

Assistant:

~CAPIRulesVector() {
      for (auto rule : rules) {
        llb_build_key_destroy((llb_build_key_t *)rule);
      }
    }